

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPReader.cpp
# Opt level: O2

int __thiscall BMPReader::open(BMPReader *this,char *__file,int __oflag,...)

{
  uint uVar1;
  FILE *__stream;
  size_t sVar2;
  RGB *pRVar3;
  ulong uVar4;
  char *__format;
  uint uVar5;
  uint infoHeaderSize;
  BitMapFileHeader fileHeader;
  BitMapCoreHeader bitMapCoreHeader;
  short local_4a;
  
  __stream = fopen(*(char **)__file,"rb");
  if (__stream == (FILE *)0x0) {
    printf("error occured when opening file:%s",*(undefined8 *)__file);
    return 0;
  }
  fileHeader.bfReserved2 = 0;
  fileHeader.bfOffBits = 0;
  fileHeader.bfType = 0;
  fileHeader.bfSize = 0;
  fileHeader.bfReserved1 = 0;
  sVar2 = fread(&fileHeader,0xe,1,__stream);
  if (sVar2 != 1) {
    __format = "Error - error occured when reading BITMAPFILEHEADER";
    goto LAB_00103487;
  }
  if (fileHeader.bfType != 0x4d42) {
    __format = "Error - this is not a BMP file that you\'re reading";
    goto LAB_00103487;
  }
  fread(&infoHeaderSize,4,1,__stream);
  fseek(__stream,-4,1);
  if (infoHeaderSize == 0xc) {
    bitMapCoreHeader.bcPlanes = 1;
    bitMapCoreHeader.bcBitCount = 0x18;
    sVar2 = fread(&bitMapCoreHeader,0xc,1,__stream);
    if (sVar2 != 1) {
LAB_00103480:
      __format = "Error - mal-structure BITMAPINFOHEADER";
      goto LAB_00103487;
    }
    this->width = bitMapCoreHeader._4_4_ & 0xffff;
    uVar5 = (uint)bitMapCoreHeader.bcHeight;
    this->height = (uint)bitMapCoreHeader.bcHeight;
    bitMapCoreHeader._4_4_ = bitMapCoreHeader._4_4_ & 0xffff;
    if (bitMapCoreHeader.bcBitCount == 0x18) {
LAB_001033a7:
      this->paddingBytes = bitMapCoreHeader._4_4_ & 3;
      pRVar3 = (RGB *)operator_new__((ulong)(uVar5 * bitMapCoreHeader._4_4_) * 3);
      this->rgbData = pRVar3;
      uVar5 = 0;
      fseek(__stream,(ulong)fileHeader.bfOffBits,0);
      uVar4 = 0xffffffffffffffff;
      while( true ) {
        if (this->height <= uVar5) {
          fclose(__stream);
          return (int)CONCAT71((int7)(uVar4 >> 8),1);
        }
        uVar1 = this->width;
        sVar2 = fread(this->rgbData + (this->height + (int)uVar4) * uVar1,3,(ulong)uVar1,__stream);
        if (sVar2 != uVar1) break;
        fseek(__stream,(ulong)this->paddingBytes,1);
        uVar5 = uVar5 + 1;
        uVar4 = (ulong)((int)uVar4 - 1);
      }
      printf("Error - something wrong when reading data from BMP file");
      if (this->rgbData == (RGB *)0x0) {
        return 0;
      }
      operator_delete__(this->rgbData);
      return 0;
    }
  }
  else {
    sVar2 = fread(&bitMapCoreHeader,0x28,1,__stream);
    if (sVar2 != 1) goto LAB_00103480;
    this->width = bitMapCoreHeader._4_4_;
    this->height = bitMapCoreHeader._8_4_;
    uVar5 = bitMapCoreHeader._8_4_;
    if (local_4a == 0x18) goto LAB_001033a7;
  }
  __format = "Error - the picture format is not consistent with our programm";
LAB_00103487:
  printf(__format);
  return 0;
}

Assistant:

bool BMPReader::open(std::string& path) {
	FILE* file = nullptr;

	if ((file = fopen(path.c_str(), "rb")) == nullptr) {
		printf("error occured when opening file:%s", path.c_str());
		return false;
	}

	BitMapFileHeader fileHeader;

	if (fread(&fileHeader, sizeof(fileHeader), 1, file) != 1) {
		printf("Error - error occured when reading BITMAPFILEHEADER");
		return false;
	}

	if(fileHeader.bfType != 0x4D42) {
		printf("Error - this is not a BMP file that you're reading");
		return false;
	}

	uint infoHeaderSize;
	fread(&infoHeaderSize, sizeof(infoHeaderSize), 1, file);
	fseek(file, -sizeof(infoHeaderSize), SEEK_CUR);
	//2中infoHeader, 通过size来判断
	if (infoHeaderSize == sizeof(BitMapCoreHeader)) {
		BitMapCoreHeader bitMapCoreHeader;
		if (fread(&bitMapCoreHeader, sizeof(bitMapCoreHeader), 1, file) != 1) {
			printf("Error - mal-structure BITMAPINFOHEADER");
			return false;
		}
		this->width = bitMapCoreHeader.bcWidth;
		this->height = bitMapCoreHeader.bcHeight;
		if (bitMapCoreHeader.bcBitCount != 24) {
			printf("Error - the picture format is not consistent with our programm");
			return false;
		}
	} else {
		BitMapInfoHeader bitMapInfoHeader;
		if (fread(&bitMapInfoHeader, sizeof(bitMapInfoHeader), 1, file) != 1) {
			printf("Error - mal-structure BITMAPINFOHEADER");
			return false;
		}
		this->width = bitMapInfoHeader.biWidth;
		this->height = bitMapInfoHeader.biHeight;
		if (bitMapInfoHeader.biBitCount != 24) {
			printf("Error - the picture format is not consistent with our programm");
			return false;
		}
	}
	//mutiple times of 4 bytes each row,
	// if width = 1, 1 * 3个像素 * 8位 = 24位, 差一个字节, paddingSize = 1
	// if width = 2, 2 * 3个 * 8位 = 48位  paddingSize = 2
	// if width = 3, paddingSize = 3
	// if width = 4, paddingSize = 0
	this->paddingBytes = width % 4;

	rgbData = new RGB[this->width * this->height];
	//跳到data数据的位置
	fseek(file, fileHeader.bfOffBits, SEEK_SET);
	for (uint i = 0; i < height; i++) {
		//read data
		if (width != fread(rgbData + (height - 1 - i) * width , sizeof(RGB), width, file)) {
			printf("Error - something wrong when reading data from BMP file");
			delete[] rgbData;
			return false;
		}
		fseek(file, paddingBytes, SEEK_CUR);
	}
	fclose(file);
	return true;
}